

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::TypeSpecializeFloatUnary
          (GlobOpt *this,Instr **pInstr,Value *src1Val,Value **pDstVal,bool skipDst)

{
  StackSym *pSVar1;
  code *pcVar2;
  ValueType valueType;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  ValueInfo *pVVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  GlobOptBlockData *pGVar8;
  StackSym *sym_00;
  char16 *pcVar9;
  StackSym *sym_1;
  StackSym *sym;
  Value *valueToTransfer;
  OpCode opcode;
  Opnd *dst;
  Opnd *src1;
  Instr **instr;
  bool skipDst_local;
  Value **pDstVal_local;
  Value *src1Val_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  valueToTransfer._6_2_ = (*pInstr)->m_opcode;
  sym = (StackSym *)0x0;
  if (src1Val == (Value *)0x0) {
LAB_005a11ea:
    bVar3 = OpCodeAttr::IsInlineBuiltIn((*pInstr)->m_opcode);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2936,
                         "(src1Val && src1Val->GetValueInfo()->IsLikelyNumber() || OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))"
                         ,
                         "src1Val && src1Val->GetValueInfo()->IsLikelyNumber() || OpCodeAttr::IsInlineBuiltIn(instr->m_opcode)"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  else {
    pVVar4 = ::Value::GetValueInfo(src1Val);
    bVar3 = ValueType::IsLikelyNumber(&pVVar4->super_ValueType);
    if (!bVar3) goto LAB_005a11ea;
  }
  bVar3 = DoFloatTypeSpec(this);
  if (!bVar3) {
    return false;
  }
  bVar3 = OpCodeAttr::IsInlineBuiltIn((*pInstr)->m_opcode);
  instr._7_1_ = skipDst;
  if (bVar3) goto LAB_005a1517;
  if (1 < (ushort)(valueToTransfer._6_2_ - BrFalse_A)) {
    if (valueToTransfer._6_2_ == Neg_A) goto LAB_005a1517;
    if (valueToTransfer._6_2_ == Conv_Num) {
      if (src1Val == (Value *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x295c,"(src1Val)","src1Val");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      valueToTransfer._6_2_ = Ld_A;
      pVVar4 = ::Value::GetValueInfo(src1Val);
      bVar3 = ValueType::IsNumber(&pVVar4->super_ValueType);
      sym = (StackSym *)src1Val;
      if (!bVar3) {
        pOVar6 = IR::Instr::GetSrc1(*pInstr);
        pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
        valueType = ValueType::Float;
        pSVar1 = pRVar7->m_sym;
        pOVar6 = IR::Instr::GetDst(*pInstr);
        sym_00 = IR::Opnd::GetStackSym(pOVar6);
        sym = (StackSym *)NewGenericValue(this,valueType,&sym_00->super_Sym);
        pGVar8 = CurrentBlockData(this);
        bVar3 = GlobOptBlockData::IsFloat64TypeSpecialized(pGVar8,&pSVar1->super_Sym);
        if (!bVar3) {
          pOVar6 = IR::Instr::GetDst(*pInstr);
          pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
          pRVar7->field_0x18 = pRVar7->field_0x18 & 0xfb | 4;
        }
      }
      goto LAB_005a1517;
    }
    if (valueToTransfer._6_2_ != Ld_A) {
      if ((valueToTransfer._6_2_ == StElemI_A) || (valueToTransfer._6_2_ == StElemI_A_Strict)) {
LAB_005a14ed:
        bVar3 = TypeSpecializeStElem(this,pInstr,src1Val,pDstVal);
        return bVar3;
      }
      if (valueToTransfer._6_2_ != ArgOut_A_InlineBuiltIn) {
        if (valueToTransfer._6_2_ != StElemC) {
          return false;
        }
        goto LAB_005a14ed;
      }
      instr._7_1_ = 1;
    }
  }
  pOVar6 = IR::Instr::GetSrc1(*pInstr);
  bVar3 = IR::Opnd::IsRegOpnd(pOVar6);
  if (bVar3) {
    pOVar6 = IR::Instr::GetSrc1(*pInstr);
    pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
    pSVar1 = pRVar7->m_sym;
    pGVar8 = CurrentBlockData(this);
    bVar3 = GlobOptBlockData::IsFloat64TypeSpecialized(pGVar8,&pSVar1->super_Sym);
    if (!bVar3) {
      return false;
    }
  }
  if ((*pInstr)->m_opcode == Ld_A) {
    sym = (StackSym *)src1Val;
  }
LAB_005a1517:
  pOVar6 = IR::Instr::GetSrc1(*pInstr);
  ToFloat64(this,*pInstr,pOVar6,this->currentBlock,src1Val,(IndirOpnd *)0x0,
            BailOutPrimitiveButString);
  if (((instr._7_1_ & 1) == 0) && (pOVar6 = IR::Instr::GetDst(*pInstr), pOVar6 != (Opnd *)0x0)) {
    TypeSpecializeFloatDst(this,*pInstr,(Value *)sym,src1Val,(Value *)0x0,pDstVal);
    bVar3 = IsLoopPrePass(this);
    if (!bVar3) {
      (*pInstr)->m_opcode = valueToTransfer._6_2_;
    }
  }
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,sourceContextId,functionId);
  if (bVar3) {
    Output::Print(L"TRACE ");
    bVar3 = IsLoopPrePass(this);
    if (bVar3) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Type specialized to FLOAT: ");
    IR::Instr::Dump(*pInstr);
    Output::Flush();
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,FloatTypeSpecPhase);
  if (bVar3) {
    Output::Print(L"Type specialized to FLOAT: ");
    pcVar9 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
    Output::Print(L"%s \n",pcVar9);
  }
  return true;
}

Assistant:

bool
GlobOpt::TypeSpecializeFloatUnary(IR::Instr **pInstr, Value *src1Val, Value **pDstVal, bool skipDst /* = false */)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *src1;
    IR::Opnd *dst;
    Js::OpCode opcode = instr->m_opcode;
    Value *valueToTransfer = nullptr;

    Assert(src1Val && src1Val->GetValueInfo()->IsLikelyNumber() || OpCodeAttr::IsInlineBuiltIn(instr->m_opcode));

    if (!this->DoFloatTypeSpec())
    {
        return false;
    }

    // For inline built-ins we need to do type specialization. Check upfront to avoid duplicating same case labels.
    if (!OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
    {
        switch (opcode)
        {
        case Js::OpCode::ArgOut_A_InlineBuiltIn:
            skipDst = true;
            // fall-through

        case Js::OpCode::Ld_A:
        case Js::OpCode::BrTrue_A:
        case Js::OpCode::BrFalse_A:
            if (instr->GetSrc1()->IsRegOpnd())
            {
                StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
                if (CurrentBlockData()->IsFloat64TypeSpecialized(sym) == false)
                {
                    // Type specializing an Ld_A isn't worth it, unless the src
                    // is already type specialized
                    return false;
                }
            }
            if (instr->m_opcode == Js::OpCode::Ld_A)
            {
                valueToTransfer = src1Val;
            }
            break;
        case Js::OpCode::Neg_A:
            break;

        case Js::OpCode::Conv_Num:
            Assert(src1Val);
            opcode = Js::OpCode::Ld_A;
            valueToTransfer = src1Val;
            if (!src1Val->GetValueInfo()->IsNumber())
            {
                StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
                valueToTransfer = NewGenericValue(ValueType::Float, instr->GetDst()->GetStackSym());
                if (CurrentBlockData()->IsFloat64TypeSpecialized(sym) == false)
                {
                    // Set the dst as a nonDeadStore. We want to keep the Ld_A to prevent the FromVar from
                    // being dead-stored, as it could cause implicit calls.
                    dst = instr->GetDst();
                    dst->AsRegOpnd()->m_dontDeadStore = true;
                }
            }
            break;

        case Js::OpCode::StElemI_A:
        case Js::OpCode::StElemI_A_Strict:
        case Js::OpCode::StElemC:
            return TypeSpecializeStElem(pInstr, src1Val, pDstVal);

        default:
            return false;
        }
    }

    // Make sure the srcs are specialized
    src1 = instr->GetSrc1();

    // Use original val when calling toFloat64 as this is what we'll use to try hoisting the fromVar if we're in a loop.
    this->ToFloat64(instr, src1, this->currentBlock, src1Val, nullptr, IR::BailOutPrimitiveButString);

    if (!skipDst)
    {
        dst = instr->GetDst();
        if (dst)
        {
            this->TypeSpecializeFloatDst(instr, valueToTransfer, src1Val, nullptr, pDstVal);
            if (!this->IsLoopPrePass())
            {
                instr->m_opcode = opcode;
            }
        }
    }

    GOPT_TRACE_INSTR(instr, _u("Type specialized to FLOAT: "));

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FloatTypeSpecPhase))
    {
        Output::Print(_u("Type specialized to FLOAT: "));
        Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
    }
#endif

    return true;
}